

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateFastInlineArrayPush(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  bool local_5a;
  byte local_59;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  LabelInstr *local_48;
  LabelInstr *labelHelper;
  LabelInstr *doneLabel;
  LabelInstr *bailOutLabelHelper;
  Opnd *pOStack_28;
  bool returnLength;
  Opnd *srcOpnd;
  Opnd *baseOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  baseOpnd = (Opnd *)instr;
  instr_local = (Instr *)this;
  if (instr->m_opcode != InlineArrayPush) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x52f7,"(instr->m_opcode == Js::OpCode::InlineArrayPush)",
                       "instr->m_opcode == Js::OpCode::InlineArrayPush");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  srcOpnd = IR::Instr::GetSrc1((Instr *)baseOpnd);
  pOStack_28 = IR::Instr::GetSrc2((Instr *)baseOpnd);
  bailOutLabelHelper._7_1_ = 0;
  pOVar4 = IR::Instr::GetDst((Instr *)baseOpnd);
  if (pOVar4 != (Opnd *)0x0) {
    bailOutLabelHelper._7_1_ = 1;
  }
  doneLabel = IR::LabelInstr::New(Label,this->m_func,true);
  labelHelper = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::InsertAfter((Instr *)baseOpnd,&labelHelper->super_Instr);
  local_48 = IR::LabelInstr::New(Label,this->m_func,true);
  bVar2 = ShouldGenerateArrayFastPath(this,srcOpnd,false,false,false);
  local_59 = 0;
  if (bVar2) {
    local_4a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(srcOpnd);
    bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_4a.field_0);
    local_5a = false;
    if (bVar2) {
      local_5a = IR::Opnd::IsVar(pOStack_28);
    }
    local_59 = local_5a ^ 0xff;
  }
  if ((local_59 & 1) != 0) {
    GenerateFastPush(this,srcOpnd,pOStack_28,(Instr *)baseOpnd,(Instr *)baseOpnd,local_48,
                     labelHelper,doneLabel,(bool)(bailOutLabelHelper._7_1_ & 1));
    IR::Instr::InsertBefore((Instr *)baseOpnd,&local_48->super_Instr);
    InsertBranch(Br,true,labelHelper,&local_48->super_Instr);
  }
  local_4c.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(srcOpnd);
  bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_4c.field_0);
  if (bVar2) {
    LowerOneBailOutKind(this,(Instr *)baseOpnd,BailOutConventionalNativeArrayAccessOnly,false,false)
    ;
    IR::Instr::InsertAfter((Instr *)baseOpnd,&doneLabel->super_Instr);
    InsertBranch(Br,labelHelper,&doneLabel->super_Instr);
  }
  GenerateHelperToArrayPushFastPath(this,(Instr *)baseOpnd,doneLabel);
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineArrayPush(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::InlineArrayPush);

    IR::Opnd * baseOpnd = instr->GetSrc1();
    IR::Opnd * srcOpnd = instr->GetSrc2();

    bool returnLength = false;
    if(instr->GetDst())
    {
        returnLength = true;
    }

    IR::LabelInstr * bailOutLabelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr->InsertAfter(doneLabel);

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    //Don't Generate fast path according to ShouldGenerateArrayFastPath()
    //AND, Don't Generate fast path if the array is LikelyNative and the element is not specialized
    if(ShouldGenerateArrayFastPath(baseOpnd, false, false, false) &&
        !(baseOpnd->GetValueType().IsLikelyNativeArray() && srcOpnd->IsVar()))
    {
        GenerateFastPush(baseOpnd, srcOpnd, instr, instr, labelHelper, doneLabel, bailOutLabelHelper, returnLength);
        instr->InsertBefore(labelHelper);
        InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);
    }

    if(baseOpnd->GetValueType().IsLikelyNativeArray())
    {
        //Lower IR::BailOutConventionalNativeArrayAccessOnly here.
        LowerOneBailOutKind(instr, IR::BailOutConventionalNativeArrayAccessOnly, false, false);
        instr->InsertAfter(bailOutLabelHelper);
        InsertBranch(Js::OpCode::Br, doneLabel, bailOutLabelHelper);
    }

    GenerateHelperToArrayPushFastPath(instr, bailOutLabelHelper);

}